

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt slang::SVInt::fromDigits
                (bitwidth_t bits,LiteralBase base,bool isSigned,bool anyUnknown,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  byte bVar1;
  bool bVar2;
  span<const_slang::logic_t,_18446744073709551615UL> digits_00;
  invalid_argument *piVar3;
  undefined8 uVar4;
  uint64_t value;
  long lVar5;
  undefined8 extraout_RDX;
  uint shift;
  bitwidth_t bitWidth;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this;
  sbyte sVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar7;
  char cVar8;
  size_t sVar9;
  SVInt SVar10;
  format_args args;
  span<const_slang::logic_t,_18446744073709551615UL> digits_01;
  string_view fmt;
  __extent_storage<18446744073709551615UL> in_stack_00000008;
  __extent_storage<18446744073709551615UL> in_stack_00000010;
  string local_68;
  uint local_48 [4];
  uint local_38;
  
  this.val._4_4_ = in_register_0000003c;
  this.val._0_4_ = bits;
  if (in_stack_00000010._M_extent_value == 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"No digits provided");
LAB_0027452a:
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bitWidth = (bitwidth_t)CONCAT71(in_register_00000031,base);
  cVar8 = (char)digits._M_ptr;
  switch(isSigned) {
  case false:
    sVar6 = 1;
    shift = 2;
    break;
  case true:
    sVar6 = 3;
    shift = 8;
    break;
  case true:
    if (0x40 < bitWidth || cVar8 != '\0') {
      if (cVar8 == '\0') {
        digits_01._M_extent._M_extent_value = in_stack_00000008._M_extent_value;
        digits_01._M_ptr = (pointer)(ulong)anyUnknown;
        SVar10 = fromDecimalDigits(bits,(bool)base,digits_01);
        uVar4 = SVar10.super_SVIntStorage._8_8_;
      }
      else {
        if (in_stack_00000010._M_extent_value != 1) {
          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar3,"If a decimal number is unknown, it must have exactly one digit.");
          goto LAB_0027452a;
        }
        if (*(uint8_t *)in_stack_00000008._M_extent_value == '@') {
          SVar10 = createFillZ((SVInt *)this.pVal,bitWidth,anyUnknown);
          uVar4 = SVar10.super_SVIntStorage._8_8_;
        }
        else {
          SVar10 = createFillX((SVInt *)this.pVal,bitWidth,anyUnknown);
          uVar4 = SVar10.super_SVIntStorage._8_8_;
        }
      }
      goto LAB_00274482;
    }
    shift = 10;
    bVar2 = true;
    sVar6 = 0;
    goto LAB_00274443;
  case true:
    sVar6 = 4;
    shift = 0x10;
    break;
  default:
    bVar2 = true;
    shift = 0;
    sVar6 = 0;
    goto LAB_00274412;
  }
  bVar2 = false;
LAB_00274412:
  if (bitWidth < 0x41 && cVar8 == '\0') {
LAB_00274443:
    sVar9 = 0;
    value = 0;
    do {
      bVar1 = ((pointer)(in_stack_00000008._M_extent_value + sVar9))->value;
      aVar7._1_7_ = 0;
      aVar7._0_1_ = bVar1;
      if ((byte)shift <= bVar1) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_48[0] = (uint)((pointer)(in_stack_00000008._M_extent_value + sVar9))->value;
        args.field_1.values_ = aVar7.values_;
        args.desc_ = (unsigned_long_long)local_48;
        fmt.size_ = 0x22;
        fmt.data_ = (char *)0x1f;
        local_38 = shift;
        ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"Digit {} too large for radix {}",fmt,args);
        std::invalid_argument::invalid_argument(piVar3,(string *)&local_68);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      lVar5 = value << sVar6;
      if (bVar2) {
        lVar5 = value * shift;
      }
      value = (long)&(aVar7.values_)->field_0 + lVar5;
      sVar9 = sVar9 + 1;
    } while (in_stack_00000010._M_extent_value != sVar9);
    SVInt((SVInt *)this.pVal,bitWidth,value,anyUnknown);
    uVar4 = extraout_RDX;
  }
  else {
    digits_00._M_extent._M_extent_value = in_stack_00000010._M_extent_value;
    digits_00._M_ptr = (pointer)in_stack_00000008._M_extent_value;
    SVar10 = fromPow2Digits(bits,(bool)base,anyUnknown,(uint)digits._M_ptr & 0xff,shift,digits_00);
    uVar4 = SVar10.super_SVIntStorage._8_8_;
  }
LAB_00274482:
  SVar10.super_SVIntStorage.bitWidth = (int)uVar4;
  SVar10.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar4 >> 0x20);
  SVar10.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar4 >> 0x28);
  SVar10.super_SVIntStorage._14_2_ = (short)((ulong)uVar4 >> 0x30);
  SVar10.super_SVIntStorage.field_0.val = this.val;
  return (SVInt)SVar10.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDigits(bitwidth_t bits, LiteralBase base, bool isSigned, bool anyUnknown,
                        std::span<logic_t const> digits) {
    if (digits.empty())
        SLANG_THROW(std::invalid_argument("No digits provided"));

    // Note: If the user specified a number too large to fit in the number of bits specified,
    // the spec says to truncate from the left, which this method will successfully do.

    uint32_t radix = 0;
    uint32_t shift = 0;
    switch (base) {
        case LiteralBase::Binary:
            radix = 2;
            shift = 1;
            break;
        case LiteralBase::Octal:
            radix = 8;
            shift = 3;
            break;
        case LiteralBase::Decimal:
            radix = 10;
            shift = 0; // can't actually shift for Decimal numbers
            break;
        case LiteralBase::Hex:
            radix = 16;
            shift = 4;
            break;
    }

    if (bits <= BITS_PER_WORD && !anyUnknown) {
        // Fast path for values that fit in one word:
        // let's do the computation entirely in a normal uint64_t instead
        // of having to do SVInt operations
        uint64_t val = 0;
        for (const logic_t& d : digits) {
            if (shift)
                val <<= shift;
            else
                val *= radix;

            val += d.value;
            if (d.value >= radix) {
                SLANG_THROW(std::invalid_argument(
                    fmt::format("Digit {} too large for radix {}", d.value, radix)));
            }
        }
        return SVInt(bits, val, isSigned);
    }

    if (radix == 10) {
        // In base ten we can't have individual bits be X or Z, it's all or nothing
        if (anyUnknown) {
            if (digits.size() != 1) {
                SLANG_THROW(std::invalid_argument(
                    "If a decimal number is unknown, it must have exactly one digit."));
            }

            if (exactlyEqual(digits[0], logic_t::z))
                return createFillZ(bits, isSigned);
            else
                return createFillX(bits, isSigned);
        }

        return fromDecimalDigits(bits, isSigned, digits);
    }

    return fromPow2Digits(bits, isSigned, anyUnknown, radix, shift, digits);
}